

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void blend_color_generic(int count,QT_FT_Span *spans,void *userData)

{
  BPP BVar1;
  long lVar2;
  char cVar3;
  QRgb QVar4;
  QThreadPool *pQVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  long in_FS_OFFSET;
  QSemaphore semaphore;
  Operator op;
  anon_class_208_6_629cd7f6 function;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&op,&DAT_0061d730,0xb0);
  getOperator(&op,(QSpanData *)userData,(QT_FT_Span *)0x0,0);
  QVar4 = QColor::rgba((QColor *)((long)userData + 0x98));
  BVar1 = qPixelLayouts[*(uint *)(*userData + 0x10)].bpp;
  memcpy(&function,&DAT_0061d660,0xd0);
  function.solidFill = op.mode == CompositionMode_Source;
  function.spans = spans;
  function.bpp = BVar1;
  memcpy(&function.op,&op,0xb0);
  uVar8 = (long)(count + 0x20) / 0x40 & 0xffffffff;
  function.data = (QSpanData *)userData;
  function.color = QVar4;
  pQVar5 = QGuiApplicationPrivate::qtGuiThreadPool();
  if (((0x5f < count) && (pQVar5 != (QThreadPool *)0x0)) &&
     (2 < (int)qPixelLayouts[*(uint *)(*userData + 0x10)].bpp)) {
    QThread::currentThread();
    cVar3 = QThreadPool::contains((QThread *)pQVar5);
    if (cVar3 == '\0') {
      _semaphore = &DAT_aaaaaaaaaaaaaaaa;
      iVar9 = 0;
      QSemaphore::QSemaphore(&semaphore,0);
      while( true ) {
        iVar10 = (int)uVar8;
        uVar8 = (ulong)(iVar10 - 1);
        if (iVar10 == 0) break;
        iVar10 = (count - iVar9) / iVar10;
        puVar6 = (undefined8 *)operator_new(0x18);
        *(undefined1 *)(puVar6 + 1) = 1;
        *puVar6 = QFactoryLoader::keyMap;
        puVar7 = (undefined8 *)operator_new(0x20);
        *puVar7 = QRunnable::QGenericRunnable::
                  Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qdrawhelper.cpp:4021:5)>
                  ::impl;
        *(int *)(puVar7 + 1) = iVar9;
        *(int *)((long)puVar7 + 0xc) = iVar10;
        puVar7[2] = &function;
        puVar7[3] = &semaphore;
        puVar6[2] = puVar7;
        QThreadPool::start((QRunnable *)pQVar5,(int)puVar6);
        iVar9 = iVar9 + iVar10;
      }
      QSemaphore::acquire((int)&semaphore);
      QSemaphore::~QSemaphore(&semaphore);
      goto LAB_005a7fb4;
    }
  }
  blend_color_generic::anon_class_208_6_629cd7f6::operator()(&function,0,count);
LAB_005a7fb4:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blend_color_generic(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);
    const Operator op = getOperator(data, nullptr, 0);
    const uint color = data->solidColor.rgba();
    const bool solidFill = op.mode == QPainter::CompositionMode_Source;
    const QPixelLayout::BPP bpp = qPixelLayouts[data->rasterBuffer->format].bpp;

    auto function = [=] (int cStart, int cEnd) {
        alignas(16) Q_DECL_UNINITIALIZED uint buffer[BufferSize];
        for (int c = cStart; c < cEnd; ++c) {
            int x = spans[c].x;
            int length = spans[c].len;
            if (solidFill && bpp >= QPixelLayout::BPP8 && spans[c].coverage == 255 && length && op.destStore) {
                // If dest doesn't matter we don't need to bother with blending or converting all the identical pixels
                op.destStore(data->rasterBuffer, x, spans[c].y, &color, 1);
                spanfill_from_first(data->rasterBuffer, bpp, x, spans[c].y, length);
                length = 0;
            }

            while (length) {
                int l = qMin(BufferSize, length);
                uint *dest = op.destFetch(buffer, data->rasterBuffer, x, spans[c].y, l);
                op.funcSolid(dest, l, color, spans[c].coverage);
                if (op.destStore)
                    op.destStore(data->rasterBuffer, x, spans[c].y, dest, l);
                length -= l;
                x += l;
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
}